

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall cmCTest::GetSubmitURL_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  ulong uVar1;
  string_view view;
  cmAlphaNum local_268;
  byte local_232;
  allocator<char> local_231;
  string local_230;
  cmAlphaNum local_210;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  undefined1 local_198 [8];
  string location;
  string local_170;
  undefined1 local_150 [8];
  string site;
  string local_128;
  undefined1 local_108 [8];
  string password;
  string local_e0;
  undefined1 local_c0 [8];
  string user;
  string local_98;
  undefined1 local_78 [8];
  string method;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  cmCTest *local_18;
  cmCTest *this_local;
  string *url;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmCTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SubmitURL",&local_41);
  GetCTestConfiguration(__return_storage_ptr__,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"DropMethod",(allocator<char> *)(user.field_2._M_local_buf + 0xf)
              );
    GetCTestConfiguration((string *)local_78,this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(user.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"DropSiteUser",
               (allocator<char> *)(password.field_2._M_local_buf + 0xf));
    GetCTestConfiguration((string *)local_c0,this,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(password.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"DropSitePassword",
               (allocator<char> *)(site.field_2._M_local_buf + 0xf));
    GetCTestConfiguration((string *)local_108,this,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)(site.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"DropSite",
               (allocator<char> *)(location.field_2._M_local_buf + 0xf));
    GetCTestConfiguration((string *)local_150,this,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)(location.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"DropLocation",&local_1b9);
    GetCTestConfiguration((string *)local_198,this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    uVar1 = std::__cxx11::string::empty();
    local_232 = 0;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_230,(string *)local_78);
    }
    else {
      std::allocator<char>::allocator();
      local_232 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"http",&local_231);
    }
    cmAlphaNum::cmAlphaNum(&local_210,&local_230);
    view = (string_view)::cm::operator____s("://",3);
    cmAlphaNum::cmAlphaNum(&local_268,view);
    cmStrCat<>(&local_1e0,&local_210,&local_268);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_230);
    if ((local_232 & 1) != 0) {
      std::allocator<char>::~allocator(&local_231);
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_c0);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,':');
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_108);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'@');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_150);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_198);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetSubmitURL()
{
  std::string url = this->GetCTestConfiguration("SubmitURL");
  if (url.empty()) {
    std::string method = this->GetCTestConfiguration("DropMethod");
    std::string user = this->GetCTestConfiguration("DropSiteUser");
    std::string password = this->GetCTestConfiguration("DropSitePassword");
    std::string site = this->GetCTestConfiguration("DropSite");
    std::string location = this->GetCTestConfiguration("DropLocation");

    url = cmStrCat(method.empty() ? "http" : method, "://"_s);
    if (!user.empty()) {
      url += user;
      if (!password.empty()) {
        url += ':';
        url += password;
      }
      url += '@';
    }
    url += site;
    url += location;
  }
  return url;
}